

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  Object *pOVar1;
  string local_30;
  
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"C","");
  pOVar1 = Object::CreateObject(&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  if (pOVar1 != (Object *)0x0) {
    (*pOVar1->_vptr_Object[1])(pOVar1);
  }
  return 0;
}

Assistant:

int main()
{
    Object* obj = Object::CreateObject("C");
    delete obj;
    return 0;
}